

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O1

QAccessibleInterface * __thiscall
QAccessibleCalendarWidget::child(QAccessibleCalendarWidget *this,int index)

{
  int iVar1;
  QWidget *pQVar2;
  QAccessibleInterface *pQVar3;
  
  if (-1 < index) {
    iVar1 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x50))();
    if (index < iVar1) {
      iVar1 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x50))(this);
      if ((index == 0) && (1 < iVar1)) {
        pQVar2 = navigationBar(this);
      }
      else {
        pQVar2 = (QWidget *)calendarView(this);
      }
      pQVar3 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(&pQVar2->super_QObject)
      ;
      return pQVar3;
    }
  }
  return (QAccessibleInterface *)0x0;
}

Assistant:

QAccessibleInterface *QAccessibleCalendarWidget::child(int index) const
{
    if (index < 0 || index >= childCount())
        return nullptr;

    if (childCount() > 1 && index == 0)
        return QAccessible::queryAccessibleInterface(navigationBar());

    return QAccessible::queryAccessibleInterface(calendarView());
}